

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

ostream * __thiscall wasm::anon_unknown_0::TypePrinter::print(TypePrinter *this,Type type)

{
  bool bVar1;
  BasicType BVar2;
  BasicHeapType BVar3;
  Tuple *tuple;
  ostream *poVar4;
  HeapType local_30;
  HeapType heapType;
  TypePrinter *this_local;
  Type type_local;
  
  this_local = (TypePrinter *)type.id;
  bVar1 = wasm::Type::isBasic((Type *)&this_local);
  if (bVar1) {
    BVar2 = wasm::Type::getBasic((Type *)&this_local);
    switch(BVar2) {
    case none:
      poVar4 = std::operator<<(this->os,"none");
      return poVar4;
    case unreachable:
      poVar4 = std::operator<<(this->os,"unreachable");
      return poVar4;
    case i32:
      poVar4 = std::operator<<(this->os,"i32");
      return poVar4;
    case i64:
      poVar4 = std::operator<<(this->os,"i64");
      return poVar4;
    case f32:
      poVar4 = std::operator<<(this->os,"f32");
      return poVar4;
    case f64:
      poVar4 = std::operator<<(this->os,"f64");
      return poVar4;
    case v128:
      poVar4 = std::operator<<(this->os,"v128");
      return poVar4;
    }
  }
  heapType.id = (uintptr_t)this_local;
  bVar1 = isTemp((Type)this_local);
  if (bVar1) {
    std::operator<<(this->os,"(; temp ;) ");
  }
  bVar1 = wasm::Type::isTuple((Type *)&this_local);
  if (bVar1) {
    tuple = wasm::Type::getTuple((Type *)&this_local);
    print(this,tuple);
  }
  else {
    bVar1 = wasm::Type::isRef((Type *)&this_local);
    if (!bVar1) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                         ,0x769);
    }
    local_30 = wasm::Type::getHeapType((Type *)&this_local);
    bVar1 = HeapType::isBasic(&local_30);
    if ((bVar1) && (bVar1 = wasm::Type::isNullable((Type *)&this_local), bVar1)) {
      BVar3 = HeapType::getBasic(&local_30);
      switch(BVar3) {
      case ext:
        poVar4 = std::operator<<(this->os,"externref");
        return poVar4;
      case func:
        poVar4 = std::operator<<(this->os,"funcref");
        return poVar4;
      case any:
        poVar4 = std::operator<<(this->os,"anyref");
        return poVar4;
      case eq:
        poVar4 = std::operator<<(this->os,"eqref");
        return poVar4;
      case i31:
        poVar4 = std::operator<<(this->os,"i31ref");
        return poVar4;
      case struct_:
        poVar4 = std::operator<<(this->os,"structref");
        return poVar4;
      case array:
        poVar4 = std::operator<<(this->os,"arrayref");
        return poVar4;
      case string:
        poVar4 = std::operator<<(this->os,"stringref");
        return poVar4;
      case stringview_wtf8:
        poVar4 = std::operator<<(this->os,"stringview_wtf8");
        return poVar4;
      case stringview_wtf16:
        poVar4 = std::operator<<(this->os,"stringview_wtf16");
        return poVar4;
      case stringview_iter:
        poVar4 = std::operator<<(this->os,"stringview_iter");
        return poVar4;
      case none:
        poVar4 = std::operator<<(this->os,"nullref");
        return poVar4;
      case noext:
        poVar4 = std::operator<<(this->os,"nullexternref");
        return poVar4;
      case nofunc:
        poVar4 = std::operator<<(this->os,"nullfuncref");
        return poVar4;
      }
    }
    std::operator<<(this->os,"(ref ");
    bVar1 = wasm::Type::isNullable((Type *)&this_local);
    if (bVar1) {
      std::operator<<(this->os,"null ");
    }
    printHeapTypeName(this,local_30);
    std::operator<<(this->os,')');
  }
  return this->os;
}

Assistant:

std::ostream& TypePrinter::print(Type type) {
  if (type.isBasic()) {
    switch (type.getBasic()) {
      case Type::none:
        return os << "none";
      case Type::unreachable:
        return os << "unreachable";
      case Type::i32:
        return os << "i32";
      case Type::i64:
        return os << "i64";
      case Type::f32:
        return os << "f32";
      case Type::f64:
        return os << "f64";
      case Type::v128:
        return os << "v128";
    }
  }

  if (isTemp(type)) {
    os << "(; temp ;) ";
  }
#if TRACE_CANONICALIZATION
  os << "(;" << ((type.getID() >> 4) % 1000) << ";) ";
#endif
  if (type.isTuple()) {
    print(type.getTuple());
  } else if (type.isRef()) {
    auto heapType = type.getHeapType();
    if (heapType.isBasic()) {
      // Print shorthands for certain basic heap types.
      if (type.isNullable()) {
        switch (heapType.getBasic()) {
          case HeapType::ext:
            return os << "externref";
          case HeapType::func:
            return os << "funcref";
          case HeapType::any:
            return os << "anyref";
          case HeapType::eq:
            return os << "eqref";
          case HeapType::i31:
            return os << "i31ref";
          case HeapType::struct_:
            return os << "structref";
          case HeapType::array:
            return os << "arrayref";
          case HeapType::string:
            return os << "stringref";
          case HeapType::stringview_wtf8:
            return os << "stringview_wtf8";
          case HeapType::stringview_wtf16:
            return os << "stringview_wtf16";
          case HeapType::stringview_iter:
            return os << "stringview_iter";
          case HeapType::none:
            return os << "nullref";
          case HeapType::noext:
            return os << "nullexternref";
          case HeapType::nofunc:
            return os << "nullfuncref";
        }
      }
    }
    os << "(ref ";
    if (type.isNullable()) {
      os << "null ";
    }
    printHeapTypeName(heapType);
    os << ')';
  } else {
    WASM_UNREACHABLE("unexpected type");
  }
  return os;
}